

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NVX_gpu_multicast2(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NVX_gpu_multicast2 != 0) {
    glad_glUploadGpuMaskNVX = (PFNGLUPLOADGPUMASKNVXPROC)(*load)("glUploadGpuMaskNVX");
    glad_glMulticastViewportArrayvNVX =
         (PFNGLMULTICASTVIEWPORTARRAYVNVXPROC)(*load)("glMulticastViewportArrayvNVX");
    glad_glMulticastViewportPositionWScaleNVX =
         (PFNGLMULTICASTVIEWPORTPOSITIONWSCALENVXPROC)
         (*load)("glMulticastViewportPositionWScaleNVX");
    glad_glMulticastScissorArrayvNVX =
         (PFNGLMULTICASTSCISSORARRAYVNVXPROC)(*load)("glMulticastScissorArrayvNVX");
    glad_glAsyncCopyBufferSubDataNVX =
         (PFNGLASYNCCOPYBUFFERSUBDATANVXPROC)(*load)("glAsyncCopyBufferSubDataNVX");
    glad_glAsyncCopyImageSubDataNVX =
         (PFNGLASYNCCOPYIMAGESUBDATANVXPROC)(*load)("glAsyncCopyImageSubDataNVX");
  }
  return;
}

Assistant:

static void load_GL_NVX_gpu_multicast2(GLADloadproc load) {
	if(!GLAD_GL_NVX_gpu_multicast2) return;
	glad_glUploadGpuMaskNVX = (PFNGLUPLOADGPUMASKNVXPROC)load("glUploadGpuMaskNVX");
	glad_glMulticastViewportArrayvNVX = (PFNGLMULTICASTVIEWPORTARRAYVNVXPROC)load("glMulticastViewportArrayvNVX");
	glad_glMulticastViewportPositionWScaleNVX = (PFNGLMULTICASTVIEWPORTPOSITIONWSCALENVXPROC)load("glMulticastViewportPositionWScaleNVX");
	glad_glMulticastScissorArrayvNVX = (PFNGLMULTICASTSCISSORARRAYVNVXPROC)load("glMulticastScissorArrayvNVX");
	glad_glAsyncCopyBufferSubDataNVX = (PFNGLASYNCCOPYBUFFERSUBDATANVXPROC)load("glAsyncCopyBufferSubDataNVX");
	glad_glAsyncCopyImageSubDataNVX = (PFNGLASYNCCOPYIMAGESUBDATANVXPROC)load("glAsyncCopyImageSubDataNVX");
}